

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bitmap.cpp
# Opt level: O3

uchar * __thiscall ON_WindowsBitmap::Bits(ON_WindowsBitmap *this,int scan_index)

{
  unsigned_short uVar1;
  ON_WindowsBITMAPINFO *pOVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  uint uVar5;
  
  iVar3 = (*(this->super_ON_Bitmap).super_ON_ModelComponent.super_ON_Object._vptr_ON_Object[0x1b])()
  ;
  pOVar2 = this->m_bmi;
  if (pOVar2 != (ON_WindowsBITMAPINFO *)0x0) {
    uVar5 = (pOVar2->bmiHeader).biClrUsed;
    if (uVar5 == 0) {
      uVar1 = (pOVar2->bmiHeader).biBitCount;
      if (uVar1 == 1) {
        uVar5 = 2;
      }
      else if (uVar1 == 8) {
        uVar5 = 0x100;
      }
      else if (uVar1 == 4) {
        uVar5 = 0x10;
      }
      else {
        uVar5 = 0;
      }
    }
    if ((-1 < scan_index && CONCAT44(extraout_var,iVar3) != 0) &&
       (iVar4 = (*(this->super_ON_Bitmap).super_ON_ModelComponent.super_ON_Object._vptr_ON_Object
                  [0x19])(this), scan_index < iVar4)) {
      return &pOVar2->bmiColors[(int)uVar5].rgbBlue +
             CONCAT44(extraout_var,iVar3) * (ulong)(uint)scan_index;
    }
  }
  return (uchar *)0x0;
}

Assistant:

const unsigned char* ON_WindowsBitmap::Bits(int scan_index) const
{
  const size_t sizeof_scan = SizeofScan();
  const unsigned char* bits = m_bmi ? (const unsigned char*)&m_bmi->bmiColors[PaletteColorCount()] : 0;
  if ( bits && sizeof_scan && scan_index >= 0 && scan_index < Height() ) {
    bits += (sizeof_scan*scan_index);
  }
  else {
    bits = 0;
  }
  return bits;
}